

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

bool __thiscall llvm::DWARFDie::addressRangeContainsAddress(DWARFDie *this,uint64_t Address)

{
  bool bVar1;
  reference this_00;
  reference pDVar2;
  DWARFAddressRange *R;
  iterator __end1;
  iterator __begin1;
  type *__range1;
  undefined1 local_58 [24];
  undefined1 local_40 [8];
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  RangesOrError;
  uint64_t Address_local;
  DWARFDie *this_local;
  
  RangesOrError._24_8_ = Address;
  getAddressRanges((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                    *)local_40,this);
  bVar1 = llvm::Expected::operator_cast_to_bool((Expected *)local_40);
  if (bVar1) {
    this_00 = Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
              ::get((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                     *)local_40);
    __end1 = std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::begin
                       (this_00);
    R = (DWARFAddressRange *)
        std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::end(this_00)
    ;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                                  *)&R);
      if (!bVar1) break;
      pDVar2 = __gnu_cxx::
               __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               ::operator*(&__end1);
      if ((pDVar2->LowPC <= (ulong)RangesOrError._24_8_) &&
         ((ulong)RangesOrError._24_8_ < pDVar2->HighPC)) {
        this_local._7_1_ = true;
        goto LAB_028145d6;
      }
      __gnu_cxx::
      __normal_iterator<llvm::DWARFAddressRange_*,_std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = false;
  }
  else {
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    takeError((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               *)local_58);
    consumeError((Error *)local_58);
    Error::~Error((Error *)local_58);
    this_local._7_1_ = false;
  }
LAB_028145d6:
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
  ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             *)local_40);
  return this_local._7_1_;
}

Assistant:

bool DWARFDie::addressRangeContainsAddress(const uint64_t Address) const {
  auto RangesOrError = getAddressRanges();
  if (!RangesOrError) {
    llvm::consumeError(RangesOrError.takeError());
    return false;
  }

  for (const auto &R : RangesOrError.get())
    if (R.LowPC <= Address && Address < R.HighPC)
      return true;
  return false;
}